

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.hpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VaryingBlockLocationsTest::~VaryingBlockLocationsTest
          (VaryingBlockLocationsTest *this)

{
  VaryingBlockLocationsTest *this_local;
  
  ~VaryingBlockLocationsTest(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

~VaryingBlockLocationsTest()
	{
	}